

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Chapters::Edition::ExpandAtomsArray(Edition *this)

{
  Atom *pAVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Atom *this_00;
  long *in_RDI;
  ulong uVar6;
  int idx;
  Atom *atoms;
  int size;
  Atom *local_a0;
  Atom *local_78;
  int local_6c;
  int local_60;
  bool local_1;
  
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    local_1 = true;
  }
  else {
    if ((int)in_RDI[1] == 0) {
      local_6c = 1;
    }
    else {
      local_6c = (int)in_RDI[1] << 1;
    }
    uVar3 = (ulong)local_6c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x30),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_78 = (Atom *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_78 = (Atom *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a0 = local_78;
        do {
          Atom::Atom(local_a0);
          local_a0 = local_a0 + 1;
        } while (local_a0 != local_78 + uVar3);
      }
    }
    if (local_78 == (Atom *)0x0) {
      local_1 = false;
    }
    else {
      for (local_60 = 0; local_60 < *(int *)((long)in_RDI + 0xc); local_60 = local_60 + 1) {
        Atom::ShallowCopy((Atom *)(*in_RDI + (long)local_60 * 0x30),local_78 + local_60);
      }
      pAVar1 = (Atom *)*in_RDI;
      if (pAVar1 != (Atom *)0x0) {
        this_00 = pAVar1 + *(long *)&pAVar1[-1].m_displays_size;
        while (pAVar1 != this_00) {
          this_00 = this_00 + -1;
          Atom::~Atom(this_00);
        }
        operator_delete__(&pAVar1[-1].m_displays_size);
      }
      *in_RDI = (long)local_78;
      *(int *)(in_RDI + 1) = local_6c;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Chapters::Edition::ExpandAtomsArray() {
  if (m_atoms_size > m_atoms_count)
    return true;  // nothing else to do

  const int size = (m_atoms_size == 0) ? 1 : 2 * m_atoms_size;

  Atom* const atoms = new (std::nothrow) Atom[size];

  if (atoms == NULL)
    return false;

  for (int idx = 0; idx < m_atoms_count; ++idx) {
    m_atoms[idx].ShallowCopy(atoms[idx]);
  }

  delete[] m_atoms;
  m_atoms = atoms;

  m_atoms_size = size;
  return true;
}